

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf.cpp
# Opt level: O0

ScalarFunction * duckdb::PrintfFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *printf_fun;
  allocator_type *in_stack_fffffffffffffde8;
  BaseScalarFunction *other;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffdf0;
  LogicalType *this;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  LogicalType *local_1a0;
  BaseScalarFunction local_180 [176];
  LogicalType local_d0 [24];
  LogicalType local_b8 [24];
  undefined1 local_a0 [32];
  LogicalType local_80 [40];
  LogicalType *local_58;
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  local_58 = local_50;
  duckdb::LogicalType::LogicalType(local_58,VARCHAR);
  local_38 = local_50;
  local_30 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe910a7);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffe00;
  iVar1._M_array = (iterator)in_stack_fffffffffffffdf8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffe04;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffdf0,iVar1,in_stack_fffffffffffffde8);
  duckdb::LogicalType::LogicalType(local_80,VARCHAR);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),in_stack_fffffffffffffdf8
            );
  duckdb::LogicalType::LogicalType(local_b8,INVALID);
  this = (LogicalType *)0x0;
  other = (BaseScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_28,local_80,local_a0,BindPrintfFunction,0,0,0,local_b8,0,0,0);
  duckdb::LogicalType::~LogicalType(local_b8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe91188);
  duckdb::LogicalType::~LogicalType(local_80);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe911a2);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe911af);
  local_1a0 = (LogicalType *)&local_38;
  do {
    local_1a0 = local_1a0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_1a0);
  } while (local_1a0 != local_50);
  duckdb::LogicalType::LogicalType(local_d0,ANY);
  LogicalType::operator=(this,(LogicalType *)other);
  duckdb::LogicalType::~LogicalType(local_d0);
  BaseScalarFunction::SetReturnsError(other);
  duckdb::BaseScalarFunction::~BaseScalarFunction(local_180);
  return in_RDI;
}

Assistant:

ScalarFunction PrintfFun::GetFunction() {
	// duckdb_fmt::printf_context, duckdb_fmt::vsprintf
	ScalarFunction printf_fun({LogicalType::VARCHAR}, LogicalType::VARCHAR,
	                          PrintfFunction<FMTPrintf, duckdb_fmt::printf_context>, BindPrintfFunction);
	printf_fun.varargs = LogicalType::ANY;
	BaseScalarFunction::SetReturnsError(printf_fun);
	return printf_fun;
}